

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O1

void __thiscall
duckdb::WindowBoundariesState::PartitionEnd
          (WindowBoundariesState *this,DataChunk *bounds,idx_t row_idx,idx_t count,bool is_jump,
          ValidityMask *partition_mask)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  reference pvVar4;
  idx_t iVar5;
  idx_t iVar6;
  idx_t n;
  idx_t local_38;
  
  pvVar4 = vector<duckdb::Vector,_true>::operator[](&bounds->data,1);
  pdVar1 = pvVar4->data;
  if (this->partition_count + this->order_count == 0) {
    if (count != 0) {
      iVar5 = 0;
      do {
        *(idx_t *)(pdVar1 + iVar5 * 8) = this->input_size;
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
  }
  else {
    pvVar4 = vector<duckdb::Vector,_true>::operator[](&bounds->data,0);
    if (count != 0) {
      pdVar2 = pvVar4->data;
      puVar3 = (partition_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar5 = 0;
      do {
        if (((puVar3[row_idx + iVar5 >> 6] >> (row_idx + iVar5 & 0x3f) & 1) != 0) ||
           ((is_jump & 1U) != 0)) {
          this->partition_end = this->input_size;
          if (this->partition_count != 0) {
            local_38 = 1;
            iVar6 = FindNextStart(partition_mask,*(long *)(pdVar2 + iVar5 * 8) + 1,this->input_size,
                                  &local_38);
            this->partition_end = iVar6;
          }
          is_jump = false;
        }
        *(idx_t *)(pdVar1 + iVar5 * 8) = this->partition_end;
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
  }
  return;
}

Assistant:

void WindowBoundariesState::PartitionEnd(DataChunk &bounds, idx_t row_idx, const idx_t count, bool is_jump,
                                         const ValidityMask &partition_mask) {
	auto partition_end_data = FlatVector::GetData<idx_t>(bounds.data[PARTITION_END]);

	//	OVER()
	if (partition_count + order_count == 0) {
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			partition_end_data[chunk_idx] = input_size;
		}
		return;
	}

	auto partition_begin_data = FlatVector::GetData<const idx_t>(bounds.data[PARTITION_BEGIN]);
	for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
		// determine partition and peer group boundaries to ultimately figure out window size
		const auto is_same_partition = !partition_mask.RowIsValidUnsafe(row_idx);

		// when the partition changes, recompute the boundaries
		if (!is_same_partition || is_jump) {
			// find end of partition
			partition_end = input_size;
			if (partition_count) {
				const auto partition_begin = partition_begin_data[chunk_idx];
				idx_t n = 1;
				partition_end = FindNextStart(partition_mask, partition_begin + 1, input_size, n);
			}
			is_jump = false;
		}

		partition_end_data[chunk_idx] = partition_end;
	}
}